

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O3

void __thiscall
MaterialSystemTest_testColorProperty_Test::TestBody(MaterialSystemTest_testColorProperty_Test *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 extraout_EAX;
  int iVar3;
  char *message;
  char *expected_predicate_value;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  Message local_70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  string local_58;
  aiColor4D local_38;
  
  local_38.r = 2.0;
  local_38.g = 3.0;
  local_38.b = 4.0;
  local_38.a = 5.0;
  expected_predicate_value = (char *)0x0;
  aiMaterial::AddBinaryProperty
            ((this->super_MaterialSystemTest).pcMat,&local_38,0x10,"testKey5",0,0,aiPTI_Float);
  local_38.r = 0.0;
  local_38.g = 0.0;
  local_38.b = 1.0;
  local_38.a = 0.0;
  local_70.ss_.ptr_._0_4_ = 0;
  local_78.data_._0_4_ =
       aiGetMaterialColor((this->super_MaterialSystemTest).pcMat,"testKey5",0,0,&local_38);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&local_58,"aiReturn_SUCCESS","pcMat->Get(\"testKey5\",0,0,clr)",
             (aiReturn *)&local_70,(aiReturn *)&local_78);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_70);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70.ss_.ptr_._4_4_,local_70.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar1._4_4_ = -(uint)(local_38.g != 3.0);
  auVar1._0_4_ = -(uint)(local_38.r != 2.0);
  auVar1._8_4_ = -(uint)(local_38.b != 4.0);
  auVar1._12_4_ = -(uint)(local_38.a != 5.0);
  iVar3 = movmskps(extraout_EAX,auVar1);
  local_70.ss_.ptr_._0_4_ = CONCAT31(local_70.ss_.ptr_._1_3_,iVar3 == 0);
  local_68.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 != 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&local_70,
               (AssertionResult *)"clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x76,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                      (char)local_58._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p));
    }
    if (CONCAT44(local_78.data_._4_4_,(aiReturn)local_78.data_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_78.data_._4_4_,(aiReturn)local_78.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(aiReturn)local_78.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testColorProperty)
{
    aiColor4D clr;
    clr.r = 2.0f;clr.g = 3.0f;clr.b = 4.0f;clr.a = 5.0f;
    this->pcMat->AddProperty(&clr,1,"testKey5");
    clr.b = 1.0f;
    clr.a = clr.g = clr.r = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey5",0,0,clr));
    EXPECT_TRUE(clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f);
}